

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O1

bool handler_selective_repeat_same_allowed_proc(Am_Object *command_obj)

{
  Am_Selective_Allowed_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *pAVar3;
  byte unaff_BL;
  Am_Value value;
  Am_Object_Method method;
  Am_Selective_Allowed_Method allowed_method;
  undefined1 local_70 [8];
  Am_Value local_68;
  Am_Object_Method local_58;
  Am_Selective_Allowed_Method local_48;
  
  local_48.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_48.Call = (Am_Selective_Allowed_Method_Type *)0x0;
  local_68.type = 0;
  local_68.value.wrapper_value = (Am_Wrapper *)0x0;
  do {
    bVar2 = Am_Object::Valid(command_obj);
    if (!bVar2) {
LAB_001c1446:
      unaff_BL = 0;
      break;
    }
    pAVar3 = Am_Object::Get(command_obj,0x14c,4);
    Am_Selective_Allowed_Method::operator=(&local_48,pAVar3);
    pAVar1 = local_48.Call;
    if (local_48.Call != (Am_Selective_Allowed_Method_Type *)0x0) {
      Am_Object::Am_Object((Am_Object *)local_70,command_obj);
      bVar2 = (*pAVar1)((Am_Object_Data *)local_70);
      Am_Object::~Am_Object((Am_Object *)local_70);
      if (!bVar2) goto LAB_001c1446;
    }
    local_58.from_wrapper = (Am_Method_Wrapper *)0x0;
    local_58.Call = (Am_Object_Method_Type *)0x0;
    pAVar3 = Am_Object::Get(command_obj,0x149,4);
    Am_Object_Method::operator=(&local_58,pAVar3);
    if (local_58.Call == (Am_Object_Method_Type *)0x0) {
      pAVar3 = Am_Object::Get(command_obj,0x167,5);
      Am_Value::operator=(&local_68,pAVar3);
      bVar2 = Am_Value::Valid(&local_68);
      if (!bVar2 || local_68.type != 0xa001) {
        unaff_BL = 0;
        goto LAB_001c1438;
      }
      bVar2 = true;
      Am_Object::operator=(command_obj,&local_68);
    }
    else {
      unaff_BL = 1;
LAB_001c1438:
      bVar2 = false;
    }
  } while (bVar2);
  Am_Value::~Am_Value(&local_68);
  return (bool)(unaff_BL & 1);
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 handler_selective_repeat_same_allowed, (Am_Object command_obj))
{
  Am_Selective_Allowed_Method allowed_method;
  Am_Value value;
  while (true) {
    if (!command_obj.Valid())
      return false;
    allowed_method =
        command_obj.Get(Am_SELECTIVE_REPEAT_SAME_ALLOWED, Am_NO_DEPENDENCY);
    if (allowed_method.Valid())
      if (!(allowed_method.Call(command_obj)))
        return false;
    Am_Object_Method method;
    method = command_obj.Get(Am_SELECTIVE_REPEAT_SAME_METHOD, Am_NO_DEPENDENCY);
    if (method.Valid())
      return true;

    value = command_obj.Peek(Am_IMPLEMENTATION_CHILD, Am_NO_DEPENDENCY);
    if (value.Valid() && value.type == Am_OBJECT)
      command_obj = value;
    else
      return false;
  }
}